

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_attach_item(nghttp2_stream *stream,nghttp2_outbound_item *item)

{
  int rv;
  nghttp2_outbound_item *item_local;
  nghttp2_stream *stream_local;
  
  if ((stream->flags & 0xc) != 0) {
    __assert_fail("(stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                  ,0x1e2,"int nghttp2_stream_attach_item(nghttp2_stream *, nghttp2_outbound_item *)"
                 );
  }
  if (stream->item == (nghttp2_outbound_item *)0x0) {
    stream->item = item;
    if ((stream->flags & 0x10) == 0) {
      stream_local._4_4_ = stream_update_dep_on_attach_item(stream);
      if (stream_local._4_4_ == 0) {
        stream_local._4_4_ = 0;
      }
      else {
        stream->item = (nghttp2_outbound_item *)0x0;
      }
    }
    else {
      stream_local._4_4_ = 0;
    }
    return stream_local._4_4_;
  }
  __assert_fail("stream->item == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0x1e3,"int nghttp2_stream_attach_item(nghttp2_stream *, nghttp2_outbound_item *)");
}

Assistant:

int nghttp2_stream_attach_item(nghttp2_stream *stream,
                               nghttp2_outbound_item *item) {
  int rv;

  assert((stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) == 0);
  assert(stream->item == NULL);

  DEBUGF("stream: stream=%d attach item=%p\n", stream->stream_id, item);

  stream->item = item;

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  rv = stream_update_dep_on_attach_item(stream);
  if (rv != 0) {
    /* This may relave stream->queued == 1, but stream->item == NULL.
       But only consequence of this error is fatal one, and session
       destruction.  In that execution path, these inconsistency does
       not matter. */
    stream->item = NULL;
    return rv;
  }

  return 0;
}